

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall Saturation::SaturationAlgorithm::~SaturationAlgorithm(SaturationAlgorithm *this)

{
  Options *pOVar1;
  _func_int **pp_Var2;
  bool bVar3;
  pointer this_00;
  SimplifyingGeneratingInference *pSVar4;
  ImmediateSimplificationEngine *pIVar5;
  ForwardSimplificationEngine *pFVar6;
  SimplificationEngine *pSVar7;
  MainLoop *in_RDI;
  BackwardSimplificationEngine *bse;
  SimplificationEngine *fse_1;
  ForwardSimplificationEngine *fse;
  SymElOutput *in_stack_ffffffffffffff60;
  Problem *this_01;
  ConsequenceFinder *in_stack_ffffffffffffff70;
  Splitter *in_stack_ffffffffffffff80;
  
  in_RDI->_vptr_MainLoop = (_func_int **)&PTR__SaturationAlgorithm_01322440;
  s_instance = (SaturationAlgorithm *)0x0;
  if ((in_RDI[8]._opt != (Options *)0x0) && (pOVar1 = in_RDI[8]._opt, pOVar1 != (Options *)0x0)) {
    Splitter::~Splitter(in_stack_ffffffffffffff80);
    ::operator_delete(pOVar1,0x1a8);
  }
  if ((in_RDI[9]._vptr_MainLoop != (_func_int **)0x0) &&
     (pp_Var2 = in_RDI[9]._vptr_MainLoop, pp_Var2 != (_func_int **)0x0)) {
    ConsequenceFinder::~ConsequenceFinder(in_stack_ffffffffffffff70);
    ::operator_delete(pp_Var2,0xa0);
  }
  if ((in_RDI[9]._opt != (Options *)0x0) && (pOVar1 = in_RDI[9]._opt, pOVar1 != (Options *)0x0)) {
    SymElOutput::~SymElOutput(in_stack_ffffffffffffff60);
    ::operator_delete(pOVar1,0x70);
  }
  RandomAccessClauseContainer::detach((RandomAccessClauseContainer *)in_RDI[5]._prb);
  this_00 = std::
            unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
            ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                          *)0xacef7c);
  RandomAccessClauseContainer::detach(&this_00->super_RandomAccessClauseContainer);
  bVar3 = Lib::ScopedPtr::operator_cast_to_bool((ScopedPtr *)(in_RDI + 6));
  if (bVar3) {
    pSVar4 = Lib::ScopedPtr<Inferences::SimplifyingGeneratingInference>::operator->
                       ((ScopedPtr<Inferences::SimplifyingGeneratingInference> *)(in_RDI + 6));
    (*(pSVar4->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  bVar3 = Lib::ScopedPtr::operator_cast_to_bool((ScopedPtr *)&in_RDI[6]._prb);
  if (bVar3) {
    pIVar5 = Lib::ScopedPtr<Inferences::ImmediateSimplificationEngine>::operator->
                       ((ScopedPtr<Inferences::ImmediateSimplificationEngine> *)&in_RDI[6]._prb);
    (*(pIVar5->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  while (in_RDI[6]._opt != (Options *)0x0) {
    pFVar6 = Lib::List<Inferences::ForwardSimplificationEngine_*>::pop
                       ((List<Inferences::ForwardSimplificationEngine_*> **)
                        in_stack_ffffffffffffff70);
    (*(pFVar6->super_InferenceEngine)._vptr_InferenceEngine[3])();
    if (pFVar6 != (ForwardSimplificationEngine *)0x0) {
      (*(pFVar6->super_InferenceEngine)._vptr_InferenceEngine[1])();
    }
  }
  while (in_RDI[7]._vptr_MainLoop != (_func_int **)0x0) {
    pSVar7 = Lib::List<Inferences::SimplificationEngine_*>::pop
                       ((List<Inferences::SimplificationEngine_*> **)in_stack_ffffffffffffff70);
    (*(pSVar7->super_InferenceEngine)._vptr_InferenceEngine[3])();
    if (pSVar7 != (SimplificationEngine *)0x0) {
      (*(pSVar7->super_InferenceEngine)._vptr_InferenceEngine[1])();
    }
  }
  while (in_RDI[7]._prb != (Problem *)0x0) {
    in_stack_ffffffffffffff70 =
         (ConsequenceFinder *)
         Lib::List<Inferences::BackwardSimplificationEngine_*>::pop
                   ((List<Inferences::BackwardSimplificationEngine_*> **)in_stack_ffffffffffffff70);
    (*((InferenceEngine *)&in_stack_ffffffffffffff70->_sa)->_vptr_InferenceEngine[3])();
    if (in_stack_ffffffffffffff70 != (ConsequenceFinder *)0x0) {
      (*((InferenceEngine *)&in_stack_ffffffffffffff70->_sa)->_vptr_InferenceEngine[1])();
    }
  }
  if (in_RDI[4]._opt != (Options *)0x0) {
    (**(code **)(*(long *)&((in_RDI[4]._opt)->_lookup)._longMap + 8))();
  }
  this_01 = in_RDI[5]._prb;
  if (this_01 != (Problem *)0x0) {
    (*(code *)this_01->_units->_tail)();
  }
  Lib::ScopedPtr<Kernel::LiteralSelector>::~ScopedPtr((ScopedPtr<Kernel::LiteralSelector> *)this_01)
  ;
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr((SmartPtr<Lib::SubscriptionObject> *)this_01);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr((SmartPtr<Lib::SubscriptionObject> *)this_01);
  std::
  unique_ptr<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
  ::~unique_ptr((unique_ptr<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
                 *)in_stack_ffffffffffffff70);
  Lib::ScopedPtr<Kernel::LiteralSelector>::~ScopedPtr((ScopedPtr<Kernel::LiteralSelector> *)this_01)
  ;
  Lib::SmartPtr<Kernel::Ordering>::~SmartPtr((SmartPtr<Kernel::Ordering> *)this_01);
  Lib::ScopedPtr<Inferences::ImmediateSimplificationEngine>::~ScopedPtr
            ((ScopedPtr<Inferences::ImmediateSimplificationEngine> *)this_01);
  Lib::ScopedPtr<Inferences::SimplifyingGeneratingInference>::~ScopedPtr
            ((ScopedPtr<Inferences::SimplifyingGeneratingInference> *)this_01);
  std::
  unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  ::~unique_ptr((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                 *)in_stack_ffffffffffffff70);
  Lib::Stack<Kernel::Clause_*>::~Stack((Stack<Kernel::Clause_*> *)this_01);
  Kernel::RCClauseStack::~RCClauseStack((RCClauseStack *)0xacf28f);
  Lib::SmartPtr<Indexing::IndexManager>::~SmartPtr((SmartPtr<Indexing::IndexManager> *)this_01);
  Kernel::MainLoop::~MainLoop(in_RDI);
  return;
}

Assistant:

SaturationAlgorithm::~SaturationAlgorithm()
{
  ASS_EQ(s_instance,this);

  s_instance = 0;

  if (_splitter) {
    delete _splitter;
  }
  if (_consFinder) {
    delete _consFinder;
  }
  if (_symEl) {
    delete _symEl;
  }

  _active->detach();
  _passive->detach();

  if (_generator) {
    _generator->detach();
  }
  if (_immediateSimplifier) {
    _immediateSimplifier->detach();
  }

  while (_fwSimplifiers) {
    ForwardSimplificationEngine* fse = FwSimplList::pop(_fwSimplifiers);
    fse->detach();
    delete fse;
  }
  while (_simplifiers) {
    SimplificationEngine* fse = SimplList::pop(_simplifiers);
    fse->detach();
    delete fse;
  }
  while (_bwSimplifiers) {
    BackwardSimplificationEngine* bse = BwSimplList::pop(_bwSimplifiers);
    bse->detach();
    delete bse;
  }

  delete _unprocessed;
  delete _active;
}